

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::vectorsEqual<CoreML::Specification::DoubleVector>
               (DoubleVector *a,DoubleVector *b)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  int local_24;
  int i;
  DoubleVector *b_local;
  DoubleVector *a_local;
  
  iVar1 = DoubleVector::vector_size(a);
  iVar2 = DoubleVector::vector_size(b);
  if (iVar1 == iVar2) {
    for (local_24 = 0; iVar1 = DoubleVector::vector_size(a), local_24 < iVar1;
        local_24 = local_24 + 1) {
      dVar3 = DoubleVector::vector(a,local_24);
      dVar4 = DoubleVector::vector(b,local_24);
      if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool vectorsEqual(const T& a, const T& b) {
            if (a.vector_size() != b.vector_size()) {
                return false;
            }
            for (int i=0; i<a.vector_size(); i++) {
                if (a.vector(i) != b.vector(i)) {
                    return false;
                }
            }
            return true;
        }